

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchSource
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmMakefile *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  cmGlobalGenerator *this_01;
  string *name;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_848;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_7e8;
  undefined1 local_750 [8];
  cmGeneratedFileStream file;
  string filename_tmp;
  string local_4c0;
  string local_4a0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_47a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_479;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  iterator local_370;
  size_type local_368;
  undefined1 local_360 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension_1;
  string local_328;
  string local_308;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2e1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  iterator local_1d8;
  size_type local_1d0;
  undefined1 local_1c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension;
  string local_190;
  string local_170;
  string local_150;
  allocator<char> local_129;
  string local_128;
  cmValue local_108;
  cmValue pchReuseFrom;
  cmGeneratorTarget *generatorTarget;
  string *filename;
  undefined1 local_e8 [8];
  string pchHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  inserted._8_8_ = arch;
  bVar1 = std::operator!=(language,"C");
  if ((((bVar1) && (bVar1 = std::operator!=(language,"CXX"), bVar1)) &&
      (bVar1 = std::operator!=(language,"OBJC"), bVar1)) &&
     (bVar1 = std::operator!=(language,"OBJCXX"), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_a8,language,config);
    std::operator+(&local_88,&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   inserted._8_8_);
    std::make_pair<std::__cxx11::string,char_const(&)[1]>
              (&local_68,&local_88,(char (*) [1])0x1193827);
    _Var5 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,char_const*>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->PchSources,&local_68);
    pchHeader.field_2._8_8_ = _Var5.first._M_node;
    inserted.first._M_node._0_1_ = _Var5.second;
    local_40._M_node = (_Base_ptr)pchHeader.field_2._8_8_;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::~pair(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    if (((byte)inserted.first._M_node & 1) != 0) {
      GetPchHeader((string *)local_e8,this,config,language,(string *)inserted._8_8_);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_40);
        a = &ppVar3->second;
        pchReuseFrom.Value = (string *)this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"PRECOMPILE_HEADERS_REUSE_FROM",&local_129);
        local_108 = GetProperty(this,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        bVar1 = cmValue::operator_cast_to_bool(&local_108);
        if (bVar1) {
          this_01 = GetGlobalGenerator(this);
          name = cmValue::operator*[abi_cxx11_(&local_108);
          pchReuseFrom.Value = (string *)cmGlobalGenerator::FindGeneratorTarget(this_01,name);
        }
        GetSupportDirectory_abi_cxx11_(&local_170,(cmGeneratorTarget *)pchReuseFrom.Value);
        cmStrCat<std::__cxx11::string,char_const(&)[11]>
                  (&local_150,&local_170,(char (*) [11])"/cmake_pch");
        std::__cxx11::string::operator=((string *)a,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        this_00 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"CMAKE_LINK_PCH",
                   (allocator<char> *)
                   ((long)&languageToExtension._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        bVar1 = cmMakefile::IsOn(this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&languageToExtension._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_478 = &local_470;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                    (local_478,(char (*) [2])0x112efc8,(char (*) [3])0x11bc505);
          local_478 = &local_430;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                    (local_478,(char (*) [4])0x1119787,(char (*) [5])0x1168176);
          local_478 = &local_3f0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
                    (local_478,(char (*) [5])"OBJC",(char (*) [3])0x110411e);
          local_478 = &local_3b0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[4],_true>
                    (local_478,(char (*) [7])"OBJCXX",(char (*) [4])0x111a8e0);
          local_370 = &local_470;
          local_368 = 4;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_47a);
          __l._M_len = local_368;
          __l._M_array = local_370;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_360,__l,&local_479,&local_47a);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_47a);
          local_848 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_370;
          do {
            local_848 = local_848 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_848);
          } while (local_848 != &local_470);
          uVar2 = std::__cxx11::string::empty();
          filename_tmp.field_2._M_local_buf[0xe] = '\0';
          if ((uVar2 & 1) == 0) {
            cmStrCat<char_const(&)[2],std::__cxx11::string_const&>
                      (&local_4c0,(char (*) [2])0x1153099,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       inserted._8_8_);
          }
          else {
            std::allocator<char>::allocator();
            filename_tmp.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4c0,"",
                       (allocator<char> *)(filename_tmp.field_2._M_local_buf + 0xf));
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_360,language);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&>
                    (&local_4a0,a,&local_4c0,pmVar4);
          std::__cxx11::string::operator=((string *)a,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4c0);
          if ((filename_tmp.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)(filename_tmp.field_2._M_local_buf + 0xf));
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_360);
        }
        else {
          local_2e0 = &local_2d8;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[2],_const_char_(&)[5],_true>
                    (local_2e0,(char (*) [2])0x112efc8,(char (*) [5])".h.c");
          local_2e0 = &local_298;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                    (local_2e0,(char (*) [4])0x1119787,(char (*) [9])".hxx.cxx");
          local_2e0 = &local_258;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[5],_const_char_(&)[10],_true>
                    (local_2e0,(char (*) [5])"OBJC",(char (*) [10])".objc.h.m");
          local_2e0 = &local_218;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                    (local_2e0,(char (*) [7])"OBJCXX",(char (*) [15])".objcxx.hxx.mm");
          local_1d8 = &local_2d8;
          local_1d0 = 4;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_2e2);
          __l_00._M_len = local_1d0;
          __l_00._M_array = local_1d8;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1c8,__l_00,&local_2e1,&local_2e2);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_2e2);
          local_7e8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1d8;
          do {
            local_7e8 = local_7e8 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_7e8);
          } while (local_7e8 != &local_2d8);
          uVar2 = std::__cxx11::string::empty();
          languageToExtension_1._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
          if ((uVar2 & 1) == 0) {
            cmStrCat<char_const(&)[2],std::__cxx11::string_const&>
                      (&local_328,(char (*) [2])0x1153099,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       inserted._8_8_);
          }
          else {
            std::allocator<char>::allocator();
            languageToExtension_1._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_328,"",
                       (allocator<char> *)
                       ((long)&languageToExtension_1._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count + 7));
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_1c8,language);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&>
                    (&local_308,a,&local_328,pmVar4);
          std::__cxx11::string::operator=((string *)a,(string *)&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
          if ((languageToExtension_1._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) !=
              0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&languageToExtension_1._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count + 7));
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1c8);
        }
        cmStrCat<std::__cxx11::string&,char_const(&)[5]>
                  ((string *)&file.field_0x260,a,(char (*) [5])0x1178abc);
        bVar1 = cmValue::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_750,(string *)&file.field_0x260,false,None);
          std::operator<<((ostream *)local_750,"/* generated by CMake */\n");
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_750);
          cmFileTimes::Copy((string *)local_e8,(string *)&file.field_0x260);
          cmSystemTools::MoveFileIfDifferent((string *)&file.field_0x260,a);
        }
        std::__cxx11::string::~string((string *)&file.field_0x260);
        bVar1 = false;
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_e8);
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchSource(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchSources.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    if (pchHeader.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    const cmGeneratorTarget* generatorTarget = this;
    cmValue pchReuseFrom =
      generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename = cmStrCat(generatorTarget->GetSupportDirectory(), "/cmake_pch");

    // For GCC the source extension will be transformed into .h[xx].gch
    if (!this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".h.c" },
        { "CXX", ".hxx.cxx" },
        { "OBJC", ".objc.h.m" },
        { "OBJCXX", ".objcxx.hxx.mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    } else {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".c" }, { "CXX", ".cxx" }, { "OBJC", ".m" }, { "OBJCXX", ".mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    }

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      {
        cmGeneratedFileStream file(filename_tmp);
        file << "/* generated by CMake */\n";
      }
      cmFileTimes::Copy(pchHeader, filename_tmp);
      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}